

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O1

VectorXd __thiscall RadarMeasurement::InitializeState(RadarMeasurement *this,int n)

{
  double dVar1;
  double dVar2;
  Sensor *pSVar3;
  _func_int **pp_Var4;
  double *pdVar5;
  double dVar6;
  Index size;
  Index index;
  Sensor *pSVar7;
  int in_EDX;
  long lVar8;
  DenseIndex extraout_RDX;
  undefined4 in_register_00000034;
  Index othersize;
  VectorXd VVar9;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,(long)in_EDX,(long)in_EDX,1);
  if (in_EDX < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                  ,0xf0,
                  "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  pSVar7 = (this->super_Measurement).sensor_;
  if ((long)pSVar7 < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(Index)pSVar7,1);
  pSVar3 = (this->super_Measurement).sensor_;
  if (pSVar3 != pSVar7) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  pSVar7 = (Sensor *)((long)pSVar3 - ((long)pSVar3 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pSVar3) {
    lVar8 = 0;
    do {
      pp_Var4 = (this->super_Measurement)._vptr_Measurement + lVar8;
      *pp_Var4 = (_func_int *)0x3ff0000000000000;
      pp_Var4[1] = (_func_int *)0x3ff0000000000000;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)pSVar7);
  }
  if ((long)pSVar7 < (long)pSVar3) {
    pp_Var4 = (this->super_Measurement)._vptr_Measurement;
    do {
      pp_Var4[(long)pSVar7] = (_func_int *)0x3ff0000000000000;
      pSVar7 = (Sensor *)((long)&pSVar7->_vptr_Sensor + 1);
    } while (pSVar3 != pSVar7);
  }
  lVar8 = *(long *)(CONCAT44(in_register_00000034,n) + 0x20);
  if ((0 < lVar8) && (lVar8 != 1)) {
    pdVar5 = *(double **)(CONCAT44(in_register_00000034,n) + 0x18);
    dVar1 = *pdVar5;
    dVar2 = pdVar5[1];
    dVar6 = cos(dVar2);
    if (0 < (long)(this->super_Measurement).sensor_) {
      *(this->super_Measurement)._vptr_Measurement = (_func_int *)(dVar6 * dVar1);
      dVar2 = sin(dVar2);
      if (1 < (long)(this->super_Measurement).sensor_) {
        (this->super_Measurement)._vptr_Measurement[1] = (_func_int *)(dVar1 * dVar2);
        VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             extraout_RDX;
        VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)this;
        return (VectorXd)
               VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x18a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x9c,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

VectorXd RadarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(1.0);
    double rho = measurements_[0];
    double phi = measurements_[1];
    x(0) = rho * cos(phi);
    x(1) = rho * sin(phi);
    //x(0) = (fabs(rho)<0.001) ? 0.01 : rho * cos(phi);
    //x(1) = (fabs(rho)<0.001) ? 0.01 : rho * sin(phi);
    // TODO: redo equations here:
    // v: rho dot is actually a predo equations here:rojection of v to vector rho.  
    // psi: the is angle between vy and v
    //x(2) = measurements_[2];
    //x(3) = phi; 
    return x;
}